

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

int32_t icu_63::TimeZone::getRegion
                  (UnicodeString *id,char *region,int32_t capacity,UErrorCode *status)

{
  int8_t iVar1;
  int32_t iVar2;
  int32_t length;
  UChar *s;
  ConstChar16Ptr local_40;
  UChar *local_38;
  
  *region = '\0';
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_40.p_ = L"Etc/Unknown";
    iVar1 = icu_63::UnicodeString::compare(id,&local_40,0xb);
    local_38 = local_40.p_;
    if ((iVar1 != '\0') && (s = getRegion(id), s != (UChar *)0x0)) {
      iVar2 = u_strlen_63(s);
      length = uprv_min_63(iVar2,capacity);
      u_UCharsToChars_63(s,region,length);
      if (capacity < iVar2) {
        *status = U_BUFFER_OVERFLOW_ERROR;
        return iVar2;
      }
      iVar2 = u_terminateChars_63(region,capacity,iVar2,status);
      return iVar2;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

int32_t
TimeZone::getRegion(const UnicodeString& id, char *region, int32_t capacity, UErrorCode& status)
{
    int32_t resultLen = 0;
    *region = 0;
    if (U_FAILURE(status)) {
        return 0;
    }

    const UChar *uregion = NULL;
    // "Etc/Unknown" is not a system zone ID,
    // but in the zone data
    if (id.compare(UNKNOWN_ZONE_ID, UNKNOWN_ZONE_ID_LENGTH) != 0) {
        uregion = getRegion(id);
    }
    if (uregion == NULL) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    resultLen = u_strlen(uregion);
    // A region code is represented by invariant characters
    u_UCharsToChars(uregion, region, uprv_min(resultLen, capacity));

    if (capacity < resultLen) {
        status = U_BUFFER_OVERFLOW_ERROR;
        return resultLen;
    }

    return u_terminateChars(region, capacity, resultLen, &status);
}